

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzrot::ArchiveOUT(ChNodeFEAxyzrot *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChFrame<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::fea::ChNodeFEAxyzrot>(marchive);
  ChNodeBase::ArchiveOUT
            ((ChNodeBase *)
             ((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
             (long)(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3]),marchive);
  ChBodyFrame::ArchiveOUT((ChBodyFrame *)&(this->super_ChNodeFEAbase).field_0x18,marchive);
  local_30._value = &this->X0;
  local_30._name = "X0";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->Force;
  local_48._name = "Force";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->Torque;
  local_60._name = "Torque";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  return;
}

Assistant:

void ChNodeFEAxyzrot::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAxyzrot>();
    // serialize parent class
    ChNodeFEAbase::ArchiveOUT(marchive);
    // serialize parent class
    ChBodyFrame::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(X0);
    marchive << CHNVP(Force);
    marchive << CHNVP(Torque);
}